

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall glslang::TParseContext::finish(TParseContext *this)

{
  EProfile EVar1;
  pointer ppTVar2;
  TIntermediate *pTVar3;
  EShLanguage EVar4;
  int iVar5;
  TSourceLoc *pTVar6;
  TLayoutGeometry TVar7;
  undefined1 *puVar8;
  undefined **ppuVar9;
  char *pcVar10;
  _func_int **pp_Var11;
  size_t i;
  ulong uVar12;
  undefined8 uStack_20;
  
  TParseContextBase::finish(&this->super_TParseContextBase);
  if ((this->super_TParseContextBase).parsingBuiltins != false) {
    return;
  }
  for (uVar12 = 0;
      ppTVar2 = (this->needsIndexLimitationChecking).
                super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                .
                super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(this->needsIndexLimitationChecking).
                             super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                             .
                             super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3);
      uVar12 = uVar12 + 1) {
    constantIndexExpressionCheck(this,&ppTVar2[uVar12]->super_TIntermNode);
  }
  EVar4 = (this->super_TParseContextBase).super_TParseVersions.language;
  switch(EVar4) {
  case EShLangTessControl:
  case EShLangTessEvaluation:
    EVar1 = (this->super_TParseContextBase).super_TParseVersions.profile;
    iVar5 = (this->super_TParseContextBase).super_TParseVersions.version;
    if (iVar5 == 0x136 && EVar1 == EEsProfile) {
      pTVar6 = TParseVersions::getCurrentLoc((TParseVersions *)this);
      pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      puVar8 = AEP_tessellation_shader;
      pcVar10 = "tessellation shaders";
      break;
    }
    if (iVar5 < 400 && EVar1 != EEsProfile) {
      pTVar6 = TParseVersions::getCurrentLoc((TParseVersions *)this);
      pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      ppuVar9 = &E_GL_ARB_tessellation_shader;
      pcVar10 = "tessellation shaders";
      goto LAB_003a89f6;
    }
    goto LAB_003a8a20;
  case EShLangGeometry:
    if (((this->super_TParseContextBase).super_TParseVersions.profile != EEsProfile) ||
       ((this->super_TParseContextBase).super_TParseVersions.version != 0x136)) goto LAB_003a8a20;
    pTVar6 = TParseVersions::getCurrentLoc((TParseVersions *)this);
    pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    puVar8 = AEP_geometry_shader;
    pcVar10 = "geometry shaders";
    break;
  default:
    goto switchD_003a891a_caseD_4;
  case EShLangCompute:
    if (((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) ||
       (0x1ad < (this->super_TParseContextBase).super_TParseVersions.version)) goto LAB_003a8a20;
    pTVar6 = TParseVersions::getCurrentLoc((TParseVersions *)this);
    pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    ppuVar9 = &E_GL_ARB_compute_shader;
    pcVar10 = "compute shaders";
LAB_003a89f6:
    uStack_20 = 1;
    puVar8 = (undefined1 *)ppuVar9;
    goto LAB_003a8a15;
  case EShLangTask:
    pTVar6 = TParseVersions::getCurrentLoc((TParseVersions *)this);
    pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    puVar8 = AEP_mesh_shader;
    pcVar10 = "task shaders";
    break;
  case EShLangMesh:
    pTVar6 = TParseVersions::getCurrentLoc((TParseVersions *)this);
    pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    puVar8 = AEP_mesh_shader;
    pcVar10 = "mesh shaders";
  }
  uStack_20 = 2;
LAB_003a8a15:
  (*pp_Var11[5])(this,pTVar6,uStack_20,puVar8,pcVar10);
LAB_003a8a20:
  EVar4 = (this->super_TParseContextBase).super_TParseVersions.language;
switchD_003a891a_caseD_4:
  if (EVar4 != EShLangGeometry) {
    return;
  }
  iVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                    (this,"GL_NV_geometry_shader_passthrough");
  if ((char)iVar5 == '\0') {
    return;
  }
  pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  if (pTVar3->outputPrimitive == ElgNone) {
    TVar7 = pTVar3->inputPrimitive;
    if (TVar7 != ElgPoints) {
      if (TVar7 == ElgTriangles) {
        TVar7 = ElgTriangleStrip;
      }
      else {
        if (TVar7 != ElgLines) goto LAB_003a8a6b;
        TVar7 = ElgLineStrip;
      }
    }
    pTVar3->outputPrimitive = TVar7;
  }
LAB_003a8a6b:
  if (pTVar3->vertices == -1) {
    TVar7 = pTVar3->inputPrimitive;
    if (1 < TVar7 - ElgPoints) {
      if (TVar7 != ElgTriangles) {
        return;
      }
      TVar7 = ElgLinesAdjacency;
    }
    pTVar3->vertices = TVar7;
  }
  return;
}

Assistant:

void TParseContext::finish()
{
    TParseContextBase::finish();

    if (parsingBuiltins)
        return;

    // Check on array indexes for ES 2.0 (version 100) limitations.
    for (size_t i = 0; i < needsIndexLimitationChecking.size(); ++i)
        constantIndexExpressionCheck(needsIndexLimitationChecking[i]);

    // Check for stages that are enabled by extension.
    // Can't do this at the beginning, it is chicken and egg to add a stage by
    // extension.
    // Stage-specific features were correctly tested for already, this is just
    // about the stage itself.
    switch (language) {
    case EShLangGeometry:
        if (isEsProfile() && version == 310)
            requireExtensions(getCurrentLoc(), Num_AEP_geometry_shader, AEP_geometry_shader, "geometry shaders");
        break;
    case EShLangTessControl:
    case EShLangTessEvaluation:
        if (isEsProfile() && version == 310)
            requireExtensions(getCurrentLoc(), Num_AEP_tessellation_shader, AEP_tessellation_shader, "tessellation shaders");
        else if (!isEsProfile() && version < 400)
            requireExtensions(getCurrentLoc(), 1, &E_GL_ARB_tessellation_shader, "tessellation shaders");
        break;
    case EShLangCompute:
        if (!isEsProfile() && version < 430)
            requireExtensions(getCurrentLoc(), 1, &E_GL_ARB_compute_shader, "compute shaders");
        break;
    case EShLangTask:
        requireExtensions(getCurrentLoc(), Num_AEP_mesh_shader, AEP_mesh_shader, "task shaders");
        break;
    case EShLangMesh:
        requireExtensions(getCurrentLoc(), Num_AEP_mesh_shader, AEP_mesh_shader, "mesh shaders");
        break;
    default:
        break;
    }

    // Set default outputs for GL_NV_geometry_shader_passthrough
    if (language == EShLangGeometry && extensionTurnedOn(E_SPV_NV_geometry_shader_passthrough)) {
        if (intermediate.getOutputPrimitive() == ElgNone) {
            switch (intermediate.getInputPrimitive()) {
            case ElgPoints:      intermediate.setOutputPrimitive(ElgPoints);    break;
            case ElgLines:       intermediate.setOutputPrimitive(ElgLineStrip); break;
            case ElgTriangles:   intermediate.setOutputPrimitive(ElgTriangleStrip); break;
            default: break;
            }
        }
        if (intermediate.getVertices() == TQualifier::layoutNotSet) {
            switch (intermediate.getInputPrimitive()) {
            case ElgPoints:      intermediate.setVertices(1); break;
            case ElgLines:       intermediate.setVertices(2); break;
            case ElgTriangles:   intermediate.setVertices(3); break;
            default: break;
            }
        }
    }
}